

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)15>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ushort uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [16];
  long lVar20;
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [16];
  
  auVar19 = _DAT_006b2530;
  if (0 < count) {
    lVar20 = 0;
    do {
      uVar2 = *(ushort *)(src + lVar20 + (long)index * 2);
      uVar21 = uVar2 >> 4 & 0xf00 | uVar2 & 0xf;
      auVar24 = psllw(ZEXT416(uVar21),4);
      auVar23 = auVar24._0_15_ & auVar19._0_15_ | ZEXT415(uVar21);
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar23._0_13_;
      auVar3[0xe] = auVar23[7];
      auVar5[0xc] = auVar23[6];
      auVar5._0_12_ = auVar23._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar23._0_11_;
      auVar6._12_3_ = auVar5._12_3_;
      auVar7[10] = auVar23[5];
      auVar7._0_10_ = auVar23._0_10_;
      auVar7._11_4_ = auVar6._11_4_;
      auVar9[9] = 0;
      auVar9._0_9_ = auVar23._0_9_;
      auVar9._10_5_ = auVar7._10_5_;
      auVar10[8] = auVar23[4];
      auVar10._0_8_ = auVar23._0_8_;
      auVar10._9_6_ = auVar9._9_6_;
      auVar13._7_8_ = 0;
      auVar13._0_7_ = auVar10._8_7_;
      Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),auVar23[3]);
      auVar17._9_6_ = 0;
      auVar17._0_9_ = Var14;
      auVar15._1_10_ = SUB1510(auVar17 << 0x30,5);
      auVar15[0] = auVar23[2];
      auVar18._11_4_ = 0;
      auVar18._0_11_ = auVar15;
      auVar11[2] = auVar23[1];
      auVar11._0_2_ = auVar23._0_2_;
      auVar11._3_12_ = SUB1512(auVar18 << 0x20,3);
      auVar12._2_13_ = auVar11._2_13_;
      auVar12._0_2_ = auVar23._0_2_ & 0xff;
      auVar4._10_2_ = 0;
      auVar4._0_10_ = auVar12._0_10_;
      auVar4._12_2_ = (short)Var14;
      auVar16._2_4_ = auVar4._10_4_;
      auVar16._0_2_ = auVar15._0_2_;
      auVar16._6_8_ = 0;
      auVar8._4_2_ = auVar11._2_2_;
      auVar8._0_4_ = auVar12._0_4_;
      auVar8._6_8_ = SUB148(auVar16 << 0x40,6);
      fVar22 = (float)auVar8._4_4_ * 0.003921569;
      pfVar1 = &buffer->r + lVar20 * 2;
      *pfVar1 = (float)(byte)(((byte)(uVar2 >> 8) & 0xf) * '\x11') * 0.003921569 * fVar22;
      pfVar1[1] = fVar22 * (float)(byte)(((byte)uVar2 >> 4) * '\x11') * 0.003921569;
      pfVar1[2] = (float)(auVar12._0_4_ & 0xffff) * 0.003921569 * fVar22;
      pfVar1[3] = fVar22;
      lVar20 = lVar20 + 2;
    } while ((ulong)(uint)count * 2 != lVar20);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}